

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void pangram_suite::test_greek(void)

{
  decoder_type decoder;
  char input [270];
  undefined4 local_28c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_decoder<char> local_268;
  value_type local_138 [269];
  value_type local_2b [3];
  
  memcpy(local_138,
         "\"\\u0393\\u03B1\\u03B6\\u03AD\\u03B5\\u03C2 \\u03BA\\u03B1\\u1F76 \\u03BC\\u03C5\\u03C1\\u03C4\\u03B9\\u1F72\\u03C2 \\u03B4\\u1F72\\u03BD \\u03B8\\u1F70 \\u03B2\\u03C1\\u1FF6 \\u03C0\\u03B9\\u1F70 \\u03C3\\u03C4\\u1F78 \\u03C7\\u03C1\\u03C5\\u03C3\\u03B1\\u03C6\\u1F76 \\u03BE\\u03AD\\u03C6\\u03C9\\u03C4\\u03BF\""
         ,0x10e);
  local_268.input.tail = local_2b;
  local_268.input.head = local_138;
  memset(&local_268.current,0,0x120);
  local_268.current.code = uninitialized;
  local_268.current.view.head = (const_pointer)0x0;
  local_268.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_268);
  local_288._M_dataplus._M_p._0_4_ = local_268.current.code;
  local_28c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x911,"void pangram_suite::test_greek()",&local_288,&local_28c);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_288,&local_268);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[104]>
            ("decoder.string_value<std::string>()",anon_var_dwarf_6fd0,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x912,"void pangram_suite::test_greek()",&local_288,anon_var_dwarf_6fe8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_288._M_dataplus._M_p._4_4_,(value)local_288._M_dataplus._M_p) !=
      &local_288.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_288._M_dataplus._M_p._4_4_,(value)local_288._M_dataplus._M_p),
                    local_288.field_2._M_allocated_capacity + 1);
  }
  if (error_unexpected_token < local_268.current.code) {
    if (local_268.current.code == end) {
      local_268.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_268);
    }
  }
  local_28c = 0;
  local_288._M_dataplus._M_p._0_4_ = local_268.current.code;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x914,"void pangram_suite::test_greek()",&local_288,&local_28c);
  return;
}

Assistant:

void test_greek()
{
    const char input[] = "\"\\u0393\\u03B1\\u03B6\\u03AD\\u03B5\\u03C2 \\u03BA\\u03B1\\u1F76 \\u03BC\\u03C5\\u03C1\\u03C4\\u03B9\\u1F72\\u03C2 \\u03B4\\u1F72\\u03BD \\u03B8\\u1F70 \\u03B2\\u03C1\\u1FF6 \\u03C0\\u03B9\\u1F70 \\u03C3\\u03C4\\u1F78 \\u03C7\\u03C1\\u03C5\\u03C3\\u03B1\\u03C6\\u1F76 \\u03BE\\u03AD\\u03C6\\u03C9\\u03C4\\u03BF\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "Γαζέες καὶ μυρτιὲς δὲν θὰ βρῶ πιὰ στὸ χρυσαφὶ ξέφωτο");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}